

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelocDirWrapper.cpp
# Opt level: O2

void __thiscall RelocBlockWrapper::validatePage(RelocBlockWrapper *this)

{
  RelocDirWrapper *pRVar1;
  PEFile *pPVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uStack_28;
  bool isOk;
  
  this->isValidPage = false;
  pRVar1 = this->parentDir;
  if ((pRVar1 != (RelocDirWrapper *)0x0) &&
     (pPVar2 = (pRVar1->super_DataDirEntryWrapper).super_PENodeWrapper.m_PE, pPVar2 != (PEFile *)0x0
     )) {
    uStack_28 = (ulong)pRVar1 & 0xffffffffffffff;
    iVar3 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[0x1c])(this,0,0xffffffffffffffff,&isOk);
    if (isOk == true) {
      iVar4 = (*(pPVar2->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x13])(pPVar2);
      this->isValidPage = CONCAT44(extraout_var,iVar3) < CONCAT44(extraout_var_00,iVar4);
    }
  }
  return;
}

Assistant:

void RelocBlockWrapper::validatePage()
{
    this->isValidPage = false;
    if (!parentDir) return;
    PEFile *m_PE = parentDir->m_PE;
    if (!m_PE) return;

    bool isOk = false;
    const offset_t pageRva = this->getNumValue(RelocBlockWrapper::PAGE_VA, &isOk);
    if (!isOk) return;

    this->isValidPage = (pageRva < m_PE->getImageSize()) ? true : false;
}